

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

basic_appender<char>
fmt::v11::detail::write_int_noinline<char,fmt::v11::basic_appender<char>,unsigned__int128>
          (basic_appender<char> out,write_int_arg<unsigned___int128> arg,format_specs *specs)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 value [16];
  uint uVar5;
  basic_appender<char> bVar6;
  char *begin;
  uint uVar7;
  char *pcVar8;
  long lVar9;
  buffer<char> *buf;
  ulong uVar10;
  int iVar11;
  bool bVar12;
  bool bVar13;
  undefined8 in_stack_ffffffffffffff38;
  bool in_stack_ffffffffffffff40;
  char in_stack_ffffffffffffff41;
  undefined2 in_stack_ffffffffffffff42;
  uint in_stack_ffffffffffffff44;
  detail local_a8 [127];
  byte local_29;
  
  begin = &stack0xffffffffffffffd8;
  uVar7 = (specs->super_basic_specs).data_;
  switch(uVar7 & 7) {
  case 4:
    pcVar8 = "0123456789ABCDEF";
    begin = &stack0xffffffffffffffd8;
    if ((uVar7 >> 0xc & 1) == 0) {
      pcVar8 = "0123456789abcdef";
      begin = &stack0xffffffffffffffd8;
    }
    do {
      begin[-1] = pcVar8[(uint)(char *)arg.abs_value & 0xf];
      begin = begin + -1;
      bVar13 = (char *)0xf < (char *)arg.abs_value;
      bVar12 = arg.abs_value._8_8_ != 0;
      uVar10 = -arg.abs_value._8_8_;
      arg.abs_value._0_8_ =
           (char *)(arg.abs_value._8_8_ << 0x3c | (ulong)(char *)arg.abs_value >> 4);
      arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 4;
    } while (bVar12 || uVar10 < bVar13);
    if ((uVar7 >> 0xd & 1) == 0) goto LAB_003b5281;
    uVar7 = (uint)((uVar7 >> 0xc & 1) == 0) << 0xd | 0x5830;
    break;
  case 5:
    lVar9 = 0;
    uVar10 = arg.abs_value._8_8_;
    pcVar8 = (char *)arg.abs_value;
    do {
      begin[-1] = (byte)pcVar8 & 7 | 0x30;
      begin = begin + -1;
      uVar3 = uVar10 << 0x3d;
      lVar9 = lVar9 + 1;
      bVar13 = (char *)0x7 < pcVar8;
      bVar12 = uVar10 != 0;
      uVar4 = -uVar10;
      uVar10 = uVar10 >> 3;
      pcVar8 = (char *)(uVar3 | (ulong)pcVar8 >> 3);
    } while (bVar12 || uVar4 < bVar13);
    if (((uVar7 >> 0xd & 1) != 0) &&
       (((char *)arg.abs_value != (char *)0x0 || arg.abs_value._8_8_ != 0) &&
        specs->precision <= lVar9)) {
      uVar7 = 0x3000;
      if (arg.prefix == 0) {
        uVar7 = 0x30;
      }
      arg.prefix = (uVar7 | arg.prefix) + 0x1000000;
    }
    goto LAB_003b5281;
  case 6:
    begin = &stack0xffffffffffffffd8;
    do {
      begin[-1] = (byte)(char *)arg.abs_value & 1 | 0x30;
      begin = begin + -1;
      bVar13 = (char *)0x1 < (char *)arg.abs_value;
      bVar12 = arg.abs_value._8_8_ != 0;
      uVar10 = -arg.abs_value._8_8_;
      arg.abs_value._0_8_ =
           (char *)(arg.abs_value._8_8_ << 0x3f | (ulong)(char *)arg.abs_value >> 1);
      arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 1;
    } while (bVar12 || uVar10 < bVar13);
    if ((uVar7 >> 0xd & 1) == 0) goto LAB_003b5281;
    uVar7 = (uint)((uVar7 >> 0xc & 1) == 0) << 0xd | 0x4230;
    break;
  case 7:
    bVar6 = write_padded<char,(fmt::v11::align)1,fmt::v11::basic_appender<char>,fmt::v11::detail::write_char<char,fmt::v11::basic_appender<char>>(fmt::v11::basic_appender<char>,char,fmt::v11::format_specs_const&)::_lambda(fmt::v11::basic_appender<char>)_1_&>
                      (out,specs,1,1,(anon_class_2_2_bf5026b7 *)&stack0xffffffffffffff40);
    return (basic_appender<char>)bVar6.container;
  default:
    value[8] = in_stack_ffffffffffffff40;
    value._0_8_ = in_stack_ffffffffffffff38;
    value[9] = in_stack_ffffffffffffff41;
    value._10_2_ = in_stack_ffffffffffffff42;
    value._12_4_ = in_stack_ffffffffffffff44;
    begin = do_format_decimal<char,unsigned__int128>
                      (local_a8,(char *)arg.abs_value,(unsigned___int128)value,arg.abs_value._8_4_);
    goto LAB_003b5281;
  }
  uVar5 = uVar7 << 8;
  if (arg.prefix == 0) {
    uVar5 = uVar7;
  }
  arg.prefix = (uVar5 | arg.prefix) + 0x2000000;
LAB_003b5281:
  iVar11 = (int)&stack0xffffffffffffffd8 - (int)begin;
  uVar5 = specs->width;
  iVar1 = specs->precision;
  uVar7 = (arg.prefix >> 0x18) + iVar11;
  if (iVar1 == -1 && uVar5 == 0) {
    uVar10 = (ulong)uVar7 + (out.container)->size_;
    if ((out.container)->capacity_ < uVar10) {
      (*(out.container)->grow_)(out.container,uVar10);
    }
    uVar7 = arg.prefix & 0xffffff;
    if ((arg.prefix & 0xffffff) != 0) {
      do {
        uVar10 = (out.container)->size_ + 1;
        if ((out.container)->capacity_ < uVar10) {
          (*(out.container)->grow_)(out.container,uVar10);
        }
        sVar2 = (out.container)->size_;
        (out.container)->size_ = sVar2 + 1;
        (out.container)->ptr_[sVar2] = (char)uVar7;
        bVar13 = 0xff < uVar7;
        uVar7 = uVar7 >> 8;
      } while (bVar13);
    }
    buffer<char>::append<char>(out.container,begin,&stack0xffffffffffffffd8);
  }
  else {
    if (((specs->super_basic_specs).data_ & 0x38) == 0x20) {
      if (uVar7 < uVar5) {
        uVar7 = uVar5;
      }
    }
    else if (iVar11 < iVar1) {
      uVar7 = iVar1 + (arg.prefix >> 0x18);
    }
    out = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::write_int<char,fmt::v11::basic_appender<char>,unsigned__int128>(fmt::v11::basic_appender<char>,fmt::v11::detail::write_int_arg<unsigned__int128>,fmt::v11::format_specs_const&)::_lambda(fmt::v11::basic_appender<char>)_1_&>
                    (out,specs,(ulong)uVar7,(ulong)uVar7,
                     (anon_class_24_4_0fb5e8cf *)&stack0xffffffffffffff40);
  }
  return (basic_appender<char>)out.container;
}

Assistant:

FMT_CONSTEXPR FMT_NOINLINE auto write_int_noinline(OutputIt out,
                                                   write_int_arg<T> arg,
                                                   const format_specs& specs)
    -> OutputIt {
  return write_int<Char>(out, arg, specs);
}